

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_replace_node(REF_CELL ref_cell,REF_INT old_node,REF_INT new_node)

{
  REF_ADJ pRVar1;
  REF_INT *pRVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  
  if (((old_node != new_node) && (-1 < old_node)) &&
     (pRVar1 = ref_cell->ref_adj, old_node < pRVar1->nnode)) {
    iVar5 = pRVar1->first[(uint)old_node];
    if (iVar5 != -1) {
      iVar3 = ref_cell->node_per;
      do {
        if (0 < iVar3) {
          iVar5 = pRVar1->item[iVar5].ref;
          lVar8 = (long)iVar5;
          lVar9 = 0;
          do {
            if (ref_cell->c2n[ref_cell->size_per * lVar8 + lVar9] == old_node) {
              uVar4 = ref_adj_remove(ref_cell->ref_adj,old_node,iVar5);
              if (uVar4 != 0) {
                pcVar7 = "unregister cell";
                uVar6 = 0x344;
LAB_00113fa6:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                       ,uVar6,"ref_cell_replace_node",(ulong)uVar4,pcVar7);
                return uVar4;
              }
              pRVar2 = ref_cell->c2n;
              pRVar2[ref_cell->size_per * lVar8 + lVar9] = new_node;
              uVar4 = ref_adj_add(ref_cell->ref_adj,pRVar2[ref_cell->size_per * lVar8 + lVar9],iVar5
                                 );
              if (uVar4 != 0) {
                pcVar7 = "register cell with id";
                uVar6 = 0x348;
                goto LAB_00113fa6;
              }
              iVar3 = ref_cell->node_per;
            }
            lVar9 = lVar9 + 1;
          } while ((int)lVar9 < iVar3);
          if (old_node < 0) {
            return 0;
          }
        }
        if (pRVar1->nnode <= old_node) {
          return 0;
        }
        iVar5 = pRVar1->first[(uint)old_node];
        if (iVar5 == -1) {
          return 0;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_replace_node(REF_CELL ref_cell, REF_INT old_node,
                                         REF_INT new_node) {
  REF_ADJ ref_adj = ref_cell_adj(ref_cell);
  REF_INT node;
  REF_INT item, cell;

  if (old_node == new_node) return REF_SUCCESS;

  item = ref_adj_first(ref_adj, old_node);
  while (ref_adj_valid(item)) {
    cell = ref_adj_item_ref(ref_adj, item);

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (old_node == ref_cell_c2n(ref_cell, node, cell)) {
        RSS(ref_adj_remove(ref_cell->ref_adj,
                           ref_cell_c2n(ref_cell, node, cell), cell),
            "unregister cell");
        ref_cell_c2n(ref_cell, node, cell) = new_node;
        RSS(ref_adj_add(ref_cell->ref_adj, ref_cell_c2n(ref_cell, node, cell),
                        cell),
            "register cell with id");
      }

    item = ref_adj_first(ref_adj, old_node);
  }

  return REF_SUCCESS;
}